

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O0

void calc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (string *Ja_in,string *Jb_in,string *Jc_in)

{
  _Setprecision _Var1;
  ostream *poVar2;
  ostream *poVar3;
  void *this;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  tc;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffd48;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffd50;
  string *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdbc;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffffd58);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffffd58);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (in_stack_fffffffffffffd58);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  ::mp_wrapper(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  ising::tc::
  triangular<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *)Jc.base.m_backend.data._M_elems._8_8_,
             (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *)Jc.base.m_backend.data._M_elems._0_8_,
             (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
              *)tc.base.m_backend._72_8_);
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::scientific);
  _Var1 = std::setprecision(100);
  poVar3 = std::operator<<(poVar2,_Var1);
  poVar3 = std::operator<<(poVar3,"# lattice: triangular\n");
  poVar3 = std::operator<<(poVar3,"# precision: ");
  this = (void *)std::ostream::operator<<(poVar3,100);
  poVar3 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"# Ja Jb Jc Tc 1/Tc");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = operator<<(poVar2,in_stack_fffffffffffffd48);
  std::operator<<(poVar3,' ');
  poVar3 = operator<<(poVar2,in_stack_fffffffffffffd48);
  std::operator<<(poVar3,' ');
  poVar3 = operator<<(poVar2,in_stack_fffffffffffffd48);
  std::operator<<(poVar3,' ');
  poVar3 = operator<<(poVar2,in_stack_fffffffffffffd48);
  std::operator<<(poVar3,' ');
  operator/(in_stack_fffffffffffffdbc,
            (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
             *)CONCAT44(_Var1._M_n,in_stack_fffffffffffffdb0));
  poVar2 = operator<<(poVar2,in_stack_fffffffffffffd48);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}